

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

void __thiscall CfgNode::BlockData::addSignalHandler(BlockData *this,int sigid,CFG *cfg)

{
  const_iterator cVar1;
  bool bVar2;
  pointer ppVar3;
  Addr AVar4;
  Addr AVar5;
  mapped_type *ppCVar6;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_int,_CFG_*>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_CFG_*>_> local_28;
  const_iterator it;
  CFG *cfg_local;
  BlockData *pBStack_10;
  int sigid_local;
  BlockData *this_local;
  
  it._M_node = (_Base_ptr)cfg;
  cfg_local._4_4_ = sigid;
  pBStack_10 = this;
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_CFG_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>::find
                 (&this->m_signalHandlers,(key_type_conflict *)((long)&cfg_local + 4));
  std::_Rb_tree_const_iterator<std::pair<const_int,_CFG_*>_>::_Rb_tree_const_iterator
            (&local_28,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::map<int,_CFG_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>::end
                 (&this->m_signalHandlers);
  std::_Rb_tree_const_iterator<std::pair<const_int,_CFG_*>_>::_Rb_tree_const_iterator
            (&local_38,&local_40);
  bVar2 = std::operator!=(&local_28,&local_38);
  cVar1 = it;
  if (bVar2) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_CFG_*>_>::operator->(&local_28);
    AVar4 = CFG::addr(ppVar3->second);
    AVar5 = CFG::addr((CFG *)it._M_node);
    if (AVar4 != AVar5) {
      __assert_fail("it->second->addr() == cfg->addr()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CfgNode.cpp"
                    ,0xa1,"void CfgNode::BlockData::addSignalHandler(int, CFG *)");
    }
  }
  else {
    ppCVar6 = std::map<int,_CFG_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>::
              operator[](&this->m_signalHandlers,(key_type_conflict *)((long)&cfg_local + 4));
    *ppCVar6 = (mapped_type)cVar1._M_node;
  }
  return;
}

Assistant:

void CfgNode::BlockData::addSignalHandler(int sigid, CFG* cfg) {
	std::map<int, CFG*>::const_iterator it = m_signalHandlers.find(sigid);
	if (it != m_signalHandlers.end()) {
		assert(it->second->addr() == cfg->addr());
	} else {
		m_signalHandlers[sigid] = cfg;
	}
}